

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpointingdevice.cpp
# Opt level: O0

void __thiscall
QPointingDevicePrivate::clearPassiveGrabbers
          (QPointingDevicePrivate *this,QPointerEvent *event,QEventPoint *point)

{
  bool bVar1;
  QLoggingCategory *pQVar2;
  EventPointData *_t3;
  QDebug *pQVar3;
  iterator o;
  QObject *in_RDX;
  QPointingDevicePrivate *in_RDI;
  long in_FS_OFFSET;
  QList<QPointer<QObject>_> *__range1;
  EventPointData *persistentPoint;
  QPointingDevice *q;
  QPointer<QObject> g;
  iterator __end1;
  iterator __begin1;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QLoggingCategory *in_stack_fffffffffffffef8;
  QLoggingCategoryMacroHolder<(QtMsgType)0> *in_stack_ffffffffffffff00;
  QMessageLogger *in_stack_ffffffffffffff10;
  QList<QPointer<QObject>_> *this_00;
  QPointingDevicePrivate *pQVar4;
  QEventPoint *in_stack_ffffffffffffff48;
  QDebug *in_stack_ffffffffffffff50;
  iterator local_a0 [5];
  QDebug local_78;
  QDebug local_70;
  QDebug local_68;
  QDebug local_60;
  QDebug local_58 [5];
  QDebug local_30;
  QDebug local_28;
  QDebug local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  int id;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = in_RDI;
  pQVar2 = (QLoggingCategory *)q_func(in_RDI);
  id = (int)((ulong)pQVar4 >> 0x20);
  QEventPoint::id((QEventPoint *)in_stack_ffffffffffffff00);
  _t3 = queryPointById(in_RDI,id);
  if (_t3 == (EventPointData *)0x0) {
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffff10,(char *)in_RDI,
               (int)((ulong)in_stack_ffffffffffffff00 >> 0x20),(char *)in_stack_fffffffffffffef8);
    QMessageLogger::warning();
    pQVar3 = QDebug::operator<<((QDebug *)_t3,(char *)in_stack_ffffffffffffff48);
    QDebug::QDebug(&local_28,pQVar3);
    ::operator<<(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    QDebug::~QDebug(&local_20);
    QDebug::~QDebug(&local_28);
    QDebug::~QDebug(&local_30);
  }
  else {
    bVar1 = QList<QPointer<QObject>_>::isEmpty((QList<QPointer<QObject>_> *)0x409039);
    if (!bVar1) {
      QtPrivateLogging::lcPointerGrab();
      bVar1 = QLoggingCategory::isDebugEnabled((QLoggingCategory *)0x409051);
      if (bVar1) {
        local_18 = &DAT_aaaaaaaaaaaaaaaa;
        local_10 = &DAT_aaaaaaaaaaaaaaaa;
        QtPrivateLogging::lcPointerGrab();
        anon_unknown.dwarf_846b95::QLoggingCategoryMacroHolder<(QtMsgType)0>::
        QLoggingCategoryMacroHolder(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
        while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                 ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
          anon_unknown.dwarf_846b95::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                    ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x4090b4);
          QMessageLogger::QMessageLogger
                    (in_stack_ffffffffffffff10,(char *)in_RDI,
                     (int)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                     (char *)in_stack_fffffffffffffef8,(char *)0x4090ca);
          QMessageLogger::debug();
          QDebug::operator<<((QDebug *)in_stack_ffffffffffffff10,(QString *)in_RDI);
          in_stack_ffffffffffffff00 =
               (QLoggingCategoryMacroHolder<(QtMsgType)0> *)
               QDebug::operator<<((QDebug *)_t3,(char *)in_stack_ffffffffffffff48);
          QEventPoint::id((QEventPoint *)in_stack_ffffffffffffff00);
          pQVar3 = QDebug::operator<<((QDebug *)in_stack_ffffffffffffff00,
                                      (int)((ulong)in_stack_fffffffffffffef8 >> 0x20));
          QDebug::QDebug(&local_70,pQVar3);
          QEventPoint::state((QEventPoint *)in_stack_ffffffffffffff00);
          ::operator<<((QDebug *)in_stack_ffffffffffffff10,(State)((ulong)in_RDI >> 0x38));
          pQVar3 = QDebug::operator<<((QDebug *)_t3,(char *)in_stack_ffffffffffffff48);
          QDebug::QDebug(&local_60,pQVar3);
          ::operator<<((QDebug *)_t3,(QList<QPointer<QObject>_> *)in_stack_ffffffffffffff10);
          QDebug::~QDebug(local_58);
          QDebug::~QDebug(&local_60);
          QDebug::~QDebug(&local_68);
          QDebug::~QDebug(&local_70);
          QDebug::~QDebug(&local_78);
          local_10 = (undefined1 *)((ulong)local_10 & 0xffffffffffffff00);
        }
      }
      this_00 = &_t3->passiveGrabbers;
      local_a0[0].i = (QPointer<QObject> *)&DAT_aaaaaaaaaaaaaaaa;
      local_a0[0] = QList<QPointer<QObject>_>::begin
                              ((QList<QPointer<QObject>_> *)in_stack_ffffffffffffff00);
      o = QList<QPointer<QObject>_>::end((QList<QPointer<QObject>_> *)in_stack_ffffffffffffff00);
      while (bVar1 = QList<QPointer<QObject>_>::iterator::operator!=(local_a0,o), bVar1) {
        QList<QPointer<QObject>_>::iterator::operator*(local_a0);
        QPointer<QObject>::QPointer
                  ((QPointer<QObject> *)in_stack_ffffffffffffff00,
                   (QPointer<QObject> *)in_stack_fffffffffffffef8);
        in_stack_fffffffffffffef8 = pQVar2;
        pQVar2 = in_stack_fffffffffffffef8;
        ::QPointer::operator_cast_to_QObject_((QPointer<QObject> *)0x409294);
        QPointingDevice::grabChanged
                  ((QPointingDevice *)this_00,in_RDX,(GrabTransition)((ulong)pQVar2 >> 0x20),
                   (QPointerEvent *)_t3,(QEventPoint *)in_RDI);
        QPointer<QObject>::~QPointer((QPointer<QObject> *)0x4092b9);
        QList<QPointer<QObject>_>::iterator::operator++(local_a0);
      }
      QList<QPointer<QObject>_>::clear((QList<QPointer<QObject>_> *)in_stack_ffffffffffffff00);
      QList<QPointer<QObject>_>::clear((QList<QPointer<QObject>_> *)in_stack_ffffffffffffff00);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPointingDevicePrivate::clearPassiveGrabbers(const QPointerEvent *event, const QEventPoint &point)
{
    Q_Q(QPointingDevice);
    auto persistentPoint = queryPointById(point.id());
    if (!persistentPoint) {
        qWarning() << "point is not in activePoints" << point;
        return;
    }
    if (persistentPoint->passiveGrabbers.isEmpty())
        return;
    if (Q_UNLIKELY(lcPointerGrab().isDebugEnabled())) {
        qCDebug(lcPointerGrab) << name << "point" << point.id() << point.state()
                               << ": clearing" << persistentPoint->passiveGrabbers;
    }
    for (auto g : persistentPoint->passiveGrabbers)
        emit q->grabChanged(g, QPointingDevice::UngrabPassive, event, point);
    persistentPoint->passiveGrabbers.clear();
    persistentPoint->passiveGrabbersContext.clear();
}